

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O1

string * __thiscall
ktx::toString_abi_cxx11_(string *__return_storage_ptr__,ktx *this,ktxSupercmpScheme scheme)

{
  int iVar1;
  char *__s;
  undefined4 in_register_00000014;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  string local_48;
  ulong local_28 [2];
  
  __s = (char *)ktxSupercompressionSchemeString
                          ((ulong)this & 0xffffffff,this,CONCAT44(in_register_00000014,scheme));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_48);
  iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
  local_28[0] = (ulong)this & 0xffffffff;
  if (iVar1 == 0) {
    fmt_00.size_ = 2;
    fmt_00.data_ = (char *)0xa;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)local_28;
    ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)0x20cbcf,fmt_00,args_00);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)__return_storage_ptr__);
    if (iVar1 != 0) {
      return __return_storage_ptr__;
    }
    fmt.size_ = 2;
    fmt.data_ = (char *)0x24;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_28;
    ::fmt::v10::vformat_abi_cxx11_(&local_48,(v10 *)"Vendor or reserved scheme (0x{:08X})",fmt,args)
    ;
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string toString(ktxSupercmpScheme scheme) noexcept {
    std::string str = ktxSupercompressionSchemeString(scheme);

    if (str == "Invalid scheme value")
        str = fmt::format("(0x{:08X})", static_cast<uint32_t>(scheme));

    else if (str == "Vendor or reserved scheme")
        str = fmt::format("Vendor or reserved scheme (0x{:08X})", static_cast<uint32_t>(scheme));

    return str;
}